

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::GetVariableLocation
          (InterfaceVariableScalarReplacement *this,Instruction *var,uint32_t *location)

{
  IRContext *this_00;
  DecorationManager *this_01;
  bool bVar1;
  uint32_t id;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  this_00 = (this->super_Pass).context_;
  if ((this_00->valid_analyses_ & kAnalysisDecorations) == kAnalysisNone) {
    IRContext::BuildDecorationManager(this_00);
  }
  this_01 = (this_00->decoration_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>._M_head_impl
  ;
  id = 0;
  if (var->has_result_id_ == true) {
    id = Instruction::GetSingleWordOperand(var,(uint)var->has_type_id_);
  }
  local_38._8_8_ = 0;
  pcStack_20 = std::
               _Function_handler<bool_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/interface_var_sroa.cpp:167:7)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/interface_var_sroa.cpp:167:7)>
             ::_M_manager;
  local_38._M_unused._M_object = location;
  bVar1 = analysis::DecorationManager::WhileEachDecoration
                    (this_01,id,0x1e,
                     (function<bool_(const_spvtools::opt::Instruction_&)> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return !bVar1;
}

Assistant:

bool InterfaceVariableScalarReplacement::GetVariableLocation(
    Instruction* var, uint32_t* location) {
  return !context()->get_decoration_mgr()->WhileEachDecoration(
      var->result_id(), uint32_t(spv::Decoration::Location),
      [location](const Instruction& inst) {
        *location =
            inst.GetSingleWordInOperand(kOpDecorateLiteralInOperandIndex);
        return false;
      });
}